

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitTableGrow(PrintExpressionContents *this,TableGrow *curr)

{
  ostream *o;
  Name name;
  TableGrow *curr_local;
  PrintExpressionContents *this_local;
  
  printMedium(this->o,"table.grow ");
  o = (ostream *)(curr->table).super_IString.str._M_str;
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)o;
  anon_unknown_217::printName((anon_unknown_217 *)(curr->table).super_IString.str._M_len,name,o);
  return;
}

Assistant:

void visitTableGrow(TableGrow* curr) {
    printMedium(o, "table.grow ");
    printName(curr->table, o);
  }